

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O3

int file_read_publickey(LIBSSH2_SESSION *session,uchar **method,size_t *method_len,
                       uchar **pubkeydata,size_t *pubkeydata_len,char *pubkeyfile)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  uchar *__ptr;
  ushort **ppuVar3;
  void *pvVar4;
  uchar *puVar5;
  uchar *puVar6;
  char *errmsg;
  long lVar7;
  ulong __n;
  uchar *src;
  char c;
  size_t tmp_len;
  uchar *tmp;
  char local_61;
  long local_60;
  uchar *local_58;
  uchar **local_50;
  size_t *local_48;
  size_t local_40;
  uchar *local_38;
  
  __stream = fopen(pubkeyfile,"r");
  if (__stream == (FILE *)0x0) {
    errmsg = "Unable to open public key file";
  }
  else {
    iVar1 = feof(__stream);
    if (iVar1 == 0) {
      __n = 0;
      local_50 = pubkeydata;
      local_48 = pubkeydata_len;
      do {
        sVar2 = fread(&local_61,1,1,__stream);
        if (((sVar2 != 1) || (local_61 == '\n')) || (local_61 == '\r')) break;
        __n = __n + 1;
        iVar1 = feof(__stream);
      } while (iVar1 == 0);
      rewind(__stream);
      if (1 < __n) {
        __ptr = (uchar *)(*session->alloc)(__n,&session->abstract);
        if (__ptr == (uchar *)0x0) {
          fclose(__stream);
          errmsg = "Unable to allocate memory for public key data";
          iVar1 = -6;
          goto LAB_0012abbb;
        }
        sVar2 = fread(__ptr,1,__n,__stream);
        if (sVar2 == __n) {
          fclose(__stream);
          ppuVar3 = __ctype_b_loc();
          lVar7 = -__n;
          do {
            __n = __n - 1;
            if ((*(byte *)((long)*ppuVar3 + (ulong)__ptr[__n] * 2 + 1) & 0x20) == 0) {
              pvVar4 = memchr(__ptr,0x20,-lVar7);
              if (pvVar4 != (void *)0x0) {
                local_58 = __ptr + -lVar7;
                src = (uchar *)((long)pvVar4 + 1);
                local_60 = (long)__ptr - (long)src;
                puVar5 = src;
                if (src <= __ptr && local_60 != 0) {
                  puVar5 = __ptr;
                }
                puVar6 = (uchar *)memchr(src,0x20,(size_t)(__ptr + (-lVar7 - (long)puVar5)));
                puVar5 = local_58;
                if (puVar6 != (uchar *)0x0) {
                  puVar5 = puVar6;
                }
                iVar1 = _libssh2_base64_decode
                                  (session,(char **)&local_38,&local_40,(char *)src,
                                   (long)puVar5 - (long)src);
                if (iVar1 == 0) {
                  *method = __ptr;
                  *method_len = 0xffffffffffffffff - local_60;
                  *local_50 = local_38;
                  *local_48 = local_40;
                  iVar1 = 0;
                }
                else {
                  (*session->free)(__ptr,&session->abstract);
                  iVar1 = _libssh2_error(session,-0x10,"Invalid key data, not base64 encoded");
                }
                return iVar1;
              }
              (*session->free)(__ptr,&session->abstract);
              errmsg = "Invalid public key data";
              goto LAB_0012abb3;
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 != 0);
          (*session->free)(__ptr,&session->abstract);
          errmsg = "Missing public key data";
        }
        else {
          (*session->free)(__ptr,&session->abstract);
          fclose(__stream);
          errmsg = "Unable to read public key from file";
        }
        goto LAB_0012abb3;
      }
    }
    else {
      rewind(__stream);
    }
    fclose(__stream);
    errmsg = "Invalid data in public key file";
  }
LAB_0012abb3:
  iVar1 = -0x10;
LAB_0012abbb:
  iVar1 = _libssh2_error(session,iVar1,errmsg);
  return iVar1;
}

Assistant:

static int
file_read_publickey(LIBSSH2_SESSION * session, unsigned char **method,
                    size_t *method_len,
                    unsigned char **pubkeydata,
                    size_t *pubkeydata_len,
                    const char *pubkeyfile)
{
    FILE *fd;
    char c;
    unsigned char *pubkey = NULL, *sp1, *sp2, *tmp;
    size_t pubkey_len = 0, sp_len;
    size_t tmp_len;

    _libssh2_debug((session, LIBSSH2_TRACE_AUTH, "Loading public key file: %s",
                   pubkeyfile));
    /* Read Public Key */
    fd = fopen(pubkeyfile, FOPEN_READTEXT);
    if(!fd) {
        return _libssh2_error(session, LIBSSH2_ERROR_FILE,
                              "Unable to open public key file");
    }
    while(!feof(fd) && 1 == fread(&c, 1, 1, fd) && c != '\r' && c != '\n') {
        pubkey_len++;
    }
    rewind(fd);

    if(pubkey_len <= 1) {
        fclose(fd);
        return _libssh2_error(session, LIBSSH2_ERROR_FILE,
                              "Invalid data in public key file");
    }

    pubkey = LIBSSH2_ALLOC(session, pubkey_len);
    if(!pubkey) {
        fclose(fd);
        return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                              "Unable to allocate memory for public key data");
    }
    if(fread(pubkey, 1, pubkey_len, fd) != pubkey_len) {
        LIBSSH2_FREE(session, pubkey);
        fclose(fd);
        return _libssh2_error(session, LIBSSH2_ERROR_FILE,
                              "Unable to read public key from file");
    }
    fclose(fd);
    /*
     * Remove trailing whitespace
     */
    while(pubkey_len && isspace(pubkey[pubkey_len - 1])) {
        pubkey_len--;
    }

    if(!pubkey_len) {
        LIBSSH2_FREE(session, pubkey);
        return _libssh2_error(session, LIBSSH2_ERROR_FILE,
                              "Missing public key data");
    }

    sp1 = memchr(pubkey, ' ', pubkey_len);
    if(!sp1) {
        LIBSSH2_FREE(session, pubkey);
        return _libssh2_error(session, LIBSSH2_ERROR_FILE,
                              "Invalid public key data");
    }

    sp1++;

    sp_len = sp1 > pubkey ? (sp1 - pubkey) : 0;
    sp2 = memchr(sp1, ' ', pubkey_len - sp_len);
    if(!sp2) {
        /* Assume that the id string is missing, but that it's okay */
        sp2 = pubkey + pubkey_len;
    }

    if(_libssh2_base64_decode(session, (char **)&tmp, &tmp_len,
                              (const char *)sp1,
                              sp2 - sp1)) {
        LIBSSH2_FREE(session, pubkey);
        return _libssh2_error(session, LIBSSH2_ERROR_FILE,
                              "Invalid key data, not base64 encoded");
    }

    /* Wasting some bytes here (okay, more than some), but since it's likely
     * to be freed soon anyway, we'll just avoid the extra free/alloc and call
     * it a wash */
    *method = pubkey;
    *method_len = sp1 - pubkey - 1;

    *pubkeydata = tmp;
    *pubkeydata_len = tmp_len;

    return 0;
}